

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

uint __thiscall o3dgc::Arithmetic_Codec::get_bits(Arithmetic_Codec *this,uint bits)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  ulong uVar4;
  
  uVar1 = this->value;
  uVar5 = this->length >> ((byte)bits & 0x1f);
  this->length = uVar5;
  uVar4 = (ulong)uVar1 % (ulong)uVar5;
  this->value = (uint)uVar4;
  if (uVar5 < 0x1000000) {
    pbVar2 = this->ac_pointer;
    uVar6 = uVar5;
    do {
      pbVar2 = pbVar2 + 1;
      this->ac_pointer = pbVar2;
      uVar3 = (int)uVar4 << 8 | (uint)*pbVar2;
      uVar4 = (ulong)uVar3;
      this->value = uVar3;
      this->length = uVar6 << 8;
      bVar7 = uVar6 < 0x10000;
      uVar6 = uVar6 << 8;
    } while (bVar7);
  }
  return uVar1 / uVar5;
}

Assistant:

unsigned Arithmetic_Codec::get_bits(unsigned bits)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
      if ((bits < 1) || (bits > 20)) AC_Error("invalid number of bits");
    #endif

      unsigned s = value / (length >>= bits);      // decode symbol, change length

      value -= length * s;                                      // update interval
      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return s;
    }